

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

void __thiscall proto2_unittest::TestOneofParsingLite::clear_oneof_field(TestOneofParsingLite *this)

{
  TestAllTypesLite *this_00;
  Cord *this_01;
  OneofFieldCase OVar1;
  Arena *pAVar2;
  TestOneofParsingLite *this_local;
  
  OVar1 = oneof_field_case(this);
  switch(OVar1) {
  case ONEOF_FIELD_NOT_SET:
    break;
  case kOneofInt32:
    break;
  case kOneofSubmessage:
    pAVar2 = google::protobuf::MessageLite::GetArena(&this->super_MessageLite);
    if (pAVar2 == (Arena *)0x0) {
      this_00 = *(TestAllTypesLite **)&this->field_0;
      if (this_00 != (TestAllTypesLite *)0x0) {
        TestAllTypesLite::~TestAllTypesLite(this_00);
        operator_delete(this_00,0x348);
      }
    }
    else if ((this->field_0)._impl_.oneof_field_.oneof_submessage_ != (TestAllTypesLite *)0x0) {
      TestAllTypesLite::Clear((this->field_0)._impl_.oneof_field_.oneof_submessage_);
    }
    break;
  case kOneofString:
    google::protobuf::internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&(this->field_0)._impl_);
    break;
  case kOneofBytes:
    google::protobuf::internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&(this->field_0)._impl_);
    break;
  case kOneofStringCord:
    google::protobuf::internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&(this->field_0)._impl_);
    break;
  case kOneofBytesCord:
    pAVar2 = google::protobuf::MessageLite::GetArena(&this->super_MessageLite);
    if ((pAVar2 == (Arena *)0x0) && (this_01 = *(Cord **)&this->field_0, this_01 != (Cord *)0x0)) {
      absl::lts_20250127::Cord::~Cord(this_01);
      operator_delete(this_01,0x10);
    }
    break;
  case kOneofStringStringPiece:
    google::protobuf::internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&(this->field_0)._impl_);
    break;
  case kOneofBytesStringPiece:
    google::protobuf::internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&(this->field_0)._impl_);
    break;
  case kOneofEnum:
  }
  (this->field_0)._impl_._oneof_case_[0] = 0;
  return;
}

Assistant:

void TestOneofParsingLite::clear_oneof_field() {
// @@protoc_insertion_point(one_of_clear_start:proto2_unittest.TestOneofParsingLite)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  switch (oneof_field_case()) {
    case kOneofInt32: {
      // No need to clear
      break;
    }
    case kOneofSubmessage: {
      if (GetArena() == nullptr) {
        delete _impl_.oneof_field_.oneof_submessage_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        if (_impl_.oneof_field_.oneof_submessage_ != nullptr) {
          _impl_.oneof_field_.oneof_submessage_->Clear();
        }
      }
      break;
    }
    case kOneofString: {
      _impl_.oneof_field_.oneof_string_.Destroy();
      break;
    }
    case kOneofBytes: {
      _impl_.oneof_field_.oneof_bytes_.Destroy();
      break;
    }
    case kOneofStringCord: {
      _impl_.oneof_field_.oneof_string_cord_.Destroy();
      break;
    }
    case kOneofBytesCord: {
      if (GetArena() == nullptr) {
        delete _impl_.oneof_field_.oneof_bytes_cord_;
      }
      break;
    }
    case kOneofStringStringPiece: {
      _impl_.oneof_field_.oneof_string_string_piece_.Destroy();
      break;
    }
    case kOneofBytesStringPiece: {
      _impl_.oneof_field_.oneof_bytes_string_piece_.Destroy();
      break;
    }
    case kOneofEnum: {
      // No need to clear
      break;
    }
    case ONEOF_FIELD_NOT_SET: {
      break;
    }
  }
  _impl_._oneof_case_[0] = ONEOF_FIELD_NOT_SET;
}